

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5AtomicCountersArrayIndexing.cpp
# Opt level: O0

void __thiscall
glcts::GPUShader5AtomicCountersArrayIndexing::initTest(GPUShader5AtomicCountersArrayIndexing *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  TestError *this_01;
  uint local_3c;
  uint local_38;
  GLuint index;
  GLuint bufferData [4];
  Functions *gl;
  GPUShader5AtomicCountersArrayIndexing *this_local;
  long lVar6;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  if (((this->super_TestCaseBase).m_is_gpu_shader5_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"GPU shader5 functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5AtomicCountersArrayIndexing.cpp"
               ,0x56);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  GVar3 = (**(code **)(lVar6 + 0x3c8))();
  this->m_program_id = GVar3;
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"Creating program object failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5AtomicCountersArrayIndexing.cpp"
                  ,0x5b);
  GVar3 = (**(code **)(lVar6 + 0x3f0))(0x91b9);
  this->m_compute_shader_id = GVar3;
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"Creating compute shader object failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5AtomicCountersArrayIndexing.cpp"
                  ,0x5e);
  bVar1 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_program_id,this->m_compute_shader_id,1,
                     &m_compute_shader_code,(bool *)0x0);
  if (!bVar1) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Could not create program object!",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5AtomicCountersArrayIndexing.cpp"
               ,0x62);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
    (&local_38)[local_3c] = local_3c;
  }
  (**(code **)(lVar6 + 0x6c8))(1,&this->m_buffer_id);
  (**(code **)(lVar6 + 0x40))(0x92c0,this->m_buffer_id);
  (**(code **)(lVar6 + 0x150))(0x92c0,0x10,&local_38,0x88ea);
  (**(code **)(lVar6 + 0x48))(0x92c0,0,this->m_buffer_id);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"Could not setup buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5AtomicCountersArrayIndexing.cpp"
                  ,0x71);
  return;
}

Assistant:

void GPUShader5AtomicCountersArrayIndexing::initTest(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check if gpu_shader5 extension is supported */
	if (!m_is_gpu_shader5_supported)
	{
		throw tcu::NotSupportedError(GPU_SHADER5_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Create program object from the supplied compute shader code */
	m_program_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "Creating program object failed");

	m_compute_shader_id = gl.createShader(GL_COMPUTE_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Creating compute shader object failed");

	if (!buildProgram(m_program_id, m_compute_shader_id, 1, &m_compute_shader_code))
	{
		TCU_FAIL("Could not create program object!");
	}

	glw::GLuint bufferData[m_atomic_counters_array_size];
	for (glw::GLuint index = 0; index < m_atomic_counters_array_size; ++index)
	{
		bufferData[index] = index;
	}

	gl.genBuffers(1, &m_buffer_id);
	gl.bindBuffer(GL_ATOMIC_COUNTER_BUFFER, m_buffer_id);
	gl.bufferData(GL_ATOMIC_COUNTER_BUFFER, m_atomic_counters_array_size * sizeof(glw::GLuint), bufferData,
				  GL_DYNAMIC_COPY);
	gl.bindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, m_buffer_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not setup buffer object!");
}